

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigSudokuVisualizer.cpp
# Opt level: O0

string * __thiscall
BigSudokuVisualizer::createBorderTopStyle_abi_cxx11_
          (string *__return_storage_ptr__,BigSudokuVisualizer *this,SudokuGitter *gitter)

{
  uint uVar1;
  string local_88 [32];
  string local_68;
  uint local_44;
  uint local_40;
  uint i;
  uint iStart;
  allocator local_2a;
  undefined1 local_29;
  uint local_28;
  uint local_24;
  uint h;
  uint size;
  SudokuGitter *gitter_local;
  BigSudokuVisualizer *this_local;
  string *border_top;
  
  _h = gitter;
  gitter_local = (SudokuGitter *)this;
  this_local = (BigSudokuVisualizer *)__return_storage_ptr__;
  local_24 = SudokuGitter::getElements(gitter);
  local_28 = 0;
  local_29 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_2a);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a);
  for (; local_28 < local_24; local_28 = uVar1 + local_28) {
    local_44 = local_28 * local_24;
    local_40 = local_44;
    for (; local_44 < local_40 + local_24; local_44 = local_44 + 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::to_string(&local_68,local_44);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    uVar1 = SudokuGitter::getQuadHeight(gitter);
  }
  std::__cxx11::string::length();
  std::__cxx11::string::substr((ulong)local_88,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_88);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

const std::string BigSudokuVisualizer::createBorderTopStyle(SudokuGitter gitter) {
    unsigned int size = gitter.getElements();
    unsigned int h = 0;
    std::string border_top = "";
    while (h < size) {
        unsigned int iStart = h * size;
        for (unsigned int i = iStart; i < iStart + size; i++) {
            border_top.append("#bigCell-");
            border_top.append(std::to_string(i));
            border_top.append(", ");
        }
        h += gitter.getQuadHeight();
    }
    border_top = border_top.substr(0, border_top.length() - 2);
    border_top.append(" { border-top: 2px solid #000; } ");
    return border_top;
}